

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sastoken.c
# Opt level: O3

_Bool SASToken_Validate(STRING_HANDLE sasToken)

{
  uint uVar1;
  char *pcVar2;
  size_t sVar3;
  char *__s;
  time_t stopTime;
  LOGGER_LOG p_Var4;
  char cVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  long lVar13;
  uint uVar14;
  uint uVar15;
  size_t __n;
  int iVar16;
  uint uVar17;
  size_t __size;
  long lVar18;
  bool bVar19;
  double dVar20;
  double dVar21;
  
  pcVar2 = STRING_c_str(sasToken);
  if (pcVar2 == (char *)0x0 || sasToken == (STRING_HANDLE)0x0) {
    return false;
  }
  sVar3 = STRING_length(sasToken);
  uVar1 = (uint)sVar3;
  if ((int)uVar1 < 1) {
    return false;
  }
  lVar13 = 3;
  uVar14 = 0xfffffffe;
  iVar16 = 0;
  uVar17 = 0xffffffff;
  uVar6 = 0xffffffff;
  uVar15 = 0xffffffff;
  uVar11 = 0xffffffff;
  uVar9 = 0xffffffff;
  iVar8 = -1;
  do {
    if (pcVar2[lVar13 + -3] == 's') {
      cVar5 = pcVar2[lVar13 + -2];
      uVar12 = (uint)lVar13;
      if (cVar5 == 'r') {
        if (pcVar2[lVar13 + -1] == '=') {
          uVar15 = uVar12;
          if (((int)uVar17 < 1) || (-1 < (int)uVar6)) {
            if ((0 < iVar8) && ((int)uVar9 < 0)) {
              cVar5 = pcVar2[lVar13 + -4];
              if (cVar5 == ' ') {
                uVar9 = uVar14 + 1;
              }
              else {
                if (cVar5 == '&') {
                  uVar9 = uVar14;
                }
                uVar15 = 0xffffffff;
                if (cVar5 == '&') {
                  uVar15 = uVar12;
                }
              }
            }
          }
          else if (pcVar2[lVar13 + -4] == ' ') {
            uVar6 = iVar16 - 1;
          }
          else {
            bVar19 = pcVar2[lVar13 + -4] == '&';
            uVar15 = 0xffffffff;
            if (bVar19) {
              uVar15 = uVar12;
            }
LAB_00103b9e:
            if (bVar19) {
              uVar6 = uVar14;
            }
          }
        }
      }
      else if (cVar5 == 'i') {
        if ((pcVar2[lVar13 + -1] == 'g') && (pcVar2[lVar13] == '=')) {
          iVar7 = uVar14 + 6;
          iVar8 = iVar7;
          if (((int)uVar15 < 1) || (-1 < (int)uVar11)) {
            if ((0 < (int)uVar17) && ((int)uVar6 < 0)) {
              if (pcVar2[lVar13 + -4] != ' ') {
                bVar19 = pcVar2[lVar13 + -4] == '&';
                if (!bVar19) {
                  iVar8 = -1;
                }
                goto LAB_00103b9e;
              }
              uVar6 = uVar14 + 1;
            }
          }
          else if (pcVar2[lVar13 + -4] == ' ') {
            uVar11 = uVar14 + 1;
          }
          else {
            iVar8 = -1;
            if (pcVar2[lVar13 + -4] == '&') {
              iVar8 = iVar7;
              uVar11 = uVar14;
            }
          }
        }
      }
      else if ((cVar5 == 'e') && (pcVar2[lVar13 + -1] == '=')) {
        uVar17 = uVar12;
        if (((int)uVar15 < 1) || (-1 < (int)uVar11)) {
          if ((0 < iVar8) && ((int)uVar9 < 0)) {
            if (pcVar2[lVar13 + -4] != ' ') {
              bVar19 = pcVar2[lVar13 + -4] == '&';
              if (bVar19) {
                uVar9 = uVar14;
              }
              goto LAB_00103bd8;
            }
            uVar9 = iVar16 - 1;
          }
        }
        else if (pcVar2[lVar13 + -4] == ' ') {
          uVar11 = iVar16 - 1;
        }
        else {
          bVar19 = pcVar2[lVar13 + -4] == '&';
          if (bVar19) {
            uVar11 = uVar14;
          }
LAB_00103bd8:
          uVar17 = 0xffffffff;
          if (bVar19) {
            uVar17 = uVar12;
          }
        }
      }
    }
    iVar16 = iVar16 + 1;
    uVar14 = uVar14 + 1;
    lVar18 = lVar13 - (ulong)(uVar1 & 0x7fffffff);
    lVar13 = lVar13 + 1;
  } while (lVar18 != 2);
  if ((int)uVar17 < 0) {
    return false;
  }
  if ((int)uVar15 < 0) {
    return false;
  }
  if (iVar8 < 0) {
    return false;
  }
  uVar14 = uVar1;
  uVar12 = uVar11;
  uVar10 = uVar9;
  if (((-1 < (int)uVar6) && (uVar14 = uVar6, uVar12 = uVar1, -1 < (int)uVar11)) &&
     (uVar12 = uVar11, uVar10 = uVar1, -1 < (int)uVar9)) {
    uVar10 = uVar9;
  }
  if ((int)uVar14 <= (int)uVar17) {
    return false;
  }
  if ((int)uVar12 <= (int)uVar15) {
    return false;
  }
  if ((int)uVar10 <= iVar8) {
    return false;
  }
  lVar13 = (ulong)uVar14 - (ulong)uVar17;
  __n = lVar13 + 1;
  __size = 0xffffffffffffffff;
  if (__n != 0) {
    __size = __n;
  }
  if ((__size == 0xffffffffffffffff) || (__s = (char *)malloc(__size), __s == (char *)0x0)) {
    p_Var4 = xlogging_get_log_function();
    if (p_Var4 == (LOGGER_LOG)0x0) {
      return false;
    }
    (*p_Var4)(AZ_LOG_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-c-shared-utility/src/sastoken.c"
              ,"SASToken_Validate",0xa3,1,"malloc error, size:%zu",__size);
    return false;
  }
  lVar18 = 0;
  memset(__s,0,__n);
  do {
    if (pcVar2[lVar18 + (ulong)uVar17] == '&') break;
    __s[lVar18] = pcVar2[lVar18 + (ulong)uVar17];
    lVar18 = lVar18 + 1;
  } while (lVar13 != lVar18);
  cVar5 = *__s;
  if (cVar5 != '\0') {
    dVar21 = 0.0;
    pcVar2 = __s;
    do {
      pcVar2 = pcVar2 + 1;
      if (9 < (byte)(cVar5 - 0x30U)) goto LAB_00103d76;
      dVar21 = dVar21 * 10.0 + (double)(int)(char)(cVar5 - 0x30U);
      cVar5 = *pcVar2;
    } while (cVar5 != '\0');
    if (0.0 < dVar21) {
      stopTime = get_time((time_t *)0x0);
      dVar20 = get_difftime(stopTime,0);
      bVar19 = dVar20 <= dVar21;
      goto LAB_00103d78;
    }
  }
LAB_00103d76:
  bVar19 = false;
LAB_00103d78:
  free(__s);
  return bVar19;
}

Assistant:

bool SASToken_Validate(STRING_HANDLE sasToken)
{
    bool result;
    /*Codes_SRS_SASTOKEN_25_025: [**SASToken_Validate shall get the SASToken value by invoking STRING_c_str on the handle.**]***/
    const char* sasTokenArray = STRING_c_str(sasToken);

    /* Codes_SRS_SASTOKEN_25_024: [**If handle is NULL then SASToken_Validate shall return false.**] */
    /* Codes_SRS_SASTOKEN_25_026: [**If STRING_c_str on handle return NULL then SASToken_Validate shall return false.**] */
    if (sasToken == NULL || sasTokenArray == NULL)
    {
        result = false;
    }
    else
    {
        int seStart = -1, seStop = -1;
        int srStart = -1, srStop = -1;
        int sigStart = -1, sigStop = -1;
        int tokenLength = (int)STRING_length(sasToken);
        int i;
        for (i = 0; i < tokenLength; i++)
        {
            if (sasTokenArray[i] == 's' && sasTokenArray[i + 1] == 'e' && sasTokenArray[i + 2] == '=') // Look for se=
            {
                seStart = i + 3;
                if (srStart > 0 && srStop < 0)
                {
                    if (sasTokenArray[i - 1] != '&' && sasTokenArray[i - 1] == ' ') // look for either & or space
                        srStop = i - 1;
                    else if (sasTokenArray[i - 1] == '&')
                        srStop = i - 2;
                    else
                        seStart = -1; // as the format is not either "&se=" or " se="
                }
                else if (sigStart > 0 && sigStop < 0)
                {
                    if (sasTokenArray[i - 1] != '&' && sasTokenArray[i - 1] == ' ')
                        sigStop = i - 1;
                    else if (sasTokenArray[i - 1] == '&')
                        sigStop = i - 2;
                    else
                        seStart = -1;
                }
            }
            else if (sasTokenArray[i] == 's' && sasTokenArray[i + 1] == 'r' && sasTokenArray[i + 2] == '=') // Look for sr=
            {
                srStart = i + 3;
                if (seStart > 0 && seStop < 0)
                {
                    if (sasTokenArray[i - 1] != '&' && sasTokenArray[i - 1] == ' ')
                        seStop = i - 1;
                    else if (sasTokenArray[i - 1] == '&')
                        seStop = i - 2;
                    else
                        srStart = -1;
                }
                else if (sigStart > 0 && sigStop < 0)
                {
                    if (sasTokenArray[i - 1] != '&' && sasTokenArray[i - 1] == ' ')
                        sigStop = i - 1;
                    else if (sasTokenArray[i - 1] == '&')
                        sigStop = i - 2;
                    else
                        srStart = -1;
                }
            }
            else if (sasTokenArray[i] == 's' && sasTokenArray[i + 1] == 'i' && sasTokenArray[i + 2] == 'g' && sasTokenArray[i + 3] == '=') // Look for sig=
            {
                sigStart = i + 4;
                if (srStart > 0 && srStop < 0)
                {
                    if (sasTokenArray[i - 1] != '&' && sasTokenArray[i - 1] == ' ')
                        srStop = i - 1;
                    else if (sasTokenArray[i - 1] == '&')
                        srStop = i - 2;
                    else
                        sigStart = -1;
                }
                else if (seStart > 0 && seStop < 0)
                {
                    if (sasTokenArray[i - 1] != '&' && sasTokenArray[i - 1] == ' ')
                        seStop = i - 1;
                    else if (sasTokenArray[i - 1] == '&')
                        seStop = i - 2;
                    else
                        sigStart = -1;
                }
            }
        }

        /*Codes_SRS_SASTOKEN_25_027: [**If SASTOKEN does not obey the SASToken format then SASToken_Validate shall return false.**]***/
        /*Codes_SRS_SASTOKEN_25_028: [**SASToken_validate shall check for the presence of sr, se and sig from the token and return false if not found**]***/
        if (seStart < 0 || srStart < 0 || sigStart < 0)
        {
            result = false;
        }
        else
        {
            if (seStop < 0)
            {
                seStop = tokenLength;
            }
            else if (srStop < 0)
            {
                srStop = tokenLength;
            }
            else if (sigStop < 0)
            {
                sigStop = tokenLength;
            }

            if ((seStop <= seStart) ||
                (srStop <= srStart) ||
                (sigStop <= sigStart))
            {
                result = false;
            }
            else
            {
                char* expiryASCII;
                size_t malloc_size = safe_subtract_size_t((size_t)seStop, (size_t)seStart);
                malloc_size = safe_add_size_t(malloc_size, 1);
                /*Codes_SRS_SASTOKEN_25_031: [**If malloc fails during validation then SASToken_Validate shall return false.**]***/
                if (malloc_size == SIZE_MAX ||
                    (expiryASCII = (char*)malloc(malloc_size)) == NULL)
                {
                    LogError("malloc error, size:%zu", malloc_size);
                    result = false;
                }
                else
                {
                    double expiry;
                    // Add the Null terminator here
                    memset(expiryASCII, 0, (size_t)seStop - (size_t)seStart + 1);
                    for (i = seStart; i < seStop; i++)
                    {
                        // The se contains the expiration values, if a & token is encountered then
                        // the se field is complete.
                        if (sasTokenArray[i] == '&')
                        {
                            break;
                        }
                        expiryASCII[i - seStart] = sasTokenArray[i];
                    }
                    expiry = getExpiryValue(expiryASCII);
                    /*Codes_SRS_SASTOKEN_25_029: [**SASToken_validate shall check for expiry time from token and if token has expired then would return false **]***/
                    if (expiry <= 0)
                    {
                        result = false;
                    }
                    else
                    {
                        double secSinceEpoch = get_difftime(get_time(NULL), (time_t)0);
                        if (expiry < secSinceEpoch)
                        {
                            /*Codes_SRS_SASTOKEN_25_029: [**SASToken_validate shall check for expiry time from token and if token has expired then would return false **]***/
                            result = false;
                        }
                        else
                        {
                            /*Codes_SRS_SASTOKEN_25_030: [**SASToken_validate shall return true only if the format is obeyed and the token has not yet expired **]***/
                            result = true;
                        }
                    }
                    free(expiryASCII);
                }
            }
        }
    }

    return result;
}